

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O2

void __thiscall
cmCTestSubmitHandler::SelectParts
          (cmCTestSubmitHandler *this,
          set<cmCTest::Part,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_> *parts)

{
  int iVar1;
  undefined8 in_RAX;
  const_iterator cVar2;
  undefined8 uStack_28;
  
  iVar1 = 0;
  uStack_28 = in_RAX;
  while (uStack_28 = CONCAT44(iVar1,(undefined4)uStack_28), iVar1 != 0xc) {
    cVar2 = std::
            _Rb_tree<cmCTest::Part,_cmCTest::Part,_std::_Identity<cmCTest::Part>,_std::less<cmCTest::Part>,_std::allocator<cmCTest::Part>_>
            ::find(&parts->_M_t,(key_type *)((long)&uStack_28 + 4));
    this->SubmitPart[uStack_28._4_4_] =
         (_Rb_tree_header *)cVar2._M_node != &(parts->_M_t)._M_impl.super__Rb_tree_header;
    iVar1 = uStack_28._4_4_ + 1;
  }
  return;
}

Assistant:

void cmCTestSubmitHandler::SelectParts(std::set<cmCTest::Part> const& parts)
{
  // Check whether each part is selected.
  for (cmCTest::Part p = cmCTest::PartStart; p != cmCTest::PartCount;
       p = static_cast<cmCTest::Part>(p + 1)) {
    this->SubmitPart[p] = parts.find(p) != parts.end();
  }
}